

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

int __thiscall String::printf(String *this,char *__format,...)

{
  void **ppvVar1;
  code *pcVar2;
  char in_AL;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 in_RCX;
  Data *pDVar6;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  detach(this,0,200);
  ppvVar1 = &ap[0].overflow_arg_area;
  local_108 = 0x3000000010;
  local_100 = ppvVar1;
  local_f8 = local_e8;
  uVar3 = vsnprintf(this->data->str,this->data->capacity,__format,&local_108);
  if (-1 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
    pDVar6 = this->data;
    if (uVar5 < pDVar6->capacity) goto LAB_00109489;
  }
  local_108 = 0x3000000010;
  local_100 = ppvVar1;
  local_f8 = local_e8;
  uVar3 = vsnprintf((char *)0x0,0,__format,&local_108);
  if ((int)uVar3 < 0) {
    iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                          ,0x2c,"result >= 0");
    if (iVar4 == 0) {
      return -1;
    }
  }
  else {
    detach(this,0,(ulong)uVar3);
    local_108 = 0x3000000010;
    local_100 = ppvVar1;
    local_f8 = local_e8;
    uVar3 = vsnprintf(this->data->str,(ulong)(uVar3 + 1),__format,&local_108);
    if ((-1 < (int)uVar3) ||
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                              ,0x33,"result >= 0"), iVar4 == 0)) {
      uVar5 = (ulong)(int)uVar3;
      pDVar6 = this->data;
LAB_00109489:
      pDVar6->len = uVar5;
      return uVar3;
    }
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

int String::printf(const char* format, ...)
{
  detach(0, 200);

  int result;
  va_list ap;
  va_start(ap, format);

  {
    result = vsnprintf((char*)data->str, data->capacity, format, ap);
    va_end(ap);
    if(result >= 0 && (usize)result < data->capacity)
    {
      data->len = result;
      return result;
    }
  }

  // buffer was too small: compute size, reserve buffer, print again
  {
    va_start(ap, format);
#ifdef _MSC_VER
    result = _vscprintf(format, ap);
#else
    result = vsnprintf(0, 0, format, ap);
#endif
    va_end(ap);
    ASSERT(result >= 0);
    if(result < 0)
      return -1;
    detach(0, result);
    va_start(ap, format);
    result = vsnprintf((char*)data->str, result + 1, format, ap);
    va_end(ap);
    ASSERT(result >= 0);
    data->len = result;
    va_end(ap);
    return result;
  }
}